

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kpr_mri.c
# Opt level: O1

int Js(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2,
      N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  long *plVar5;
  sunrealtype *rpar;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar8 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x10);
  pdVar4 = *(double **)((long)y->content + 0x10);
  dVar2 = *pdVar4;
  dVar3 = pdVar4[1];
  dVar6 = cos(t);
  dVar7 = sin(t);
  *(double *)**(undefined8 **)((long)J->content + 0x20) =
       ((dVar6 * 0.5 + 1.0) * dVar8 + dVar7 * 0.5) / ((dVar2 + dVar2) * dVar2) + dVar8 * 0.5;
  dVar8 = cos(t * *(double *)((long)user_data + 8));
  plVar5 = *(long **)((long)J->content + 0x20);
  pdVar4 = (double *)plVar5[1];
  *pdVar4 = ((dVar8 + 2.0) * dVar1) / ((dVar3 + dVar3) * dVar3) + dVar1 * 0.5;
  *(undefined8 *)(*plVar5 + 8) = 0;
  pdVar4[1] = 0.0;
  return 0;
}

Assistant:

static int Js(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* rpar   = (sunrealtype*)user_data;
  const sunrealtype G = rpar[0];
  const sunrealtype e = rpar[2];
  const sunrealtype u = NV_Ith_S(y, 0);
  const sunrealtype v = NV_Ith_S(y, 1);

  /* fill in the Jacobian:
     [G/2 + (G*(1+r(t))-rdot(t))/(2*u^2)   e/2+e*(2+s(t))/(2*v^2)]
     [                 0                             0           ] */
  SM_ELEMENT_D(J, 0, 0) = G / TWO + (G * (ONE + r(t, rpar)) - rdot(t, rpar)) /
                                      (2 * u * u);
  SM_ELEMENT_D(J, 0, 1) = e / TWO + e * (TWO + s(t, rpar)) / (TWO * v * v);
  SM_ELEMENT_D(J, 1, 0) = ZERO;
  SM_ELEMENT_D(J, 1, 1) = ZERO;

  /* Return with success */
  return 0;
}